

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

void normalize(lzma_mf *mf)

{
  uint uVar1;
  uint local_1c;
  uint local_18;
  uint32_t i_1;
  uint32_t i;
  uint32_t subvalue;
  lzma_mf *mf_local;
  
  if (mf->read_pos + mf->offset == -1) {
    uVar1 = -mf->cyclic_size - 1;
    for (local_18 = 0; local_18 < mf->hash_count; local_18 = local_18 + 1) {
      if (uVar1 < mf->hash[local_18]) {
        mf->hash[local_18] = mf->hash[local_18] - uVar1;
      }
      else {
        mf->hash[local_18] = 0;
      }
    }
    for (local_1c = 0; local_1c < mf->sons_count; local_1c = local_1c + 1) {
      if (uVar1 < mf->son[local_1c]) {
        mf->son[local_1c] = mf->son[local_1c] - uVar1;
      }
      else {
        mf->son[local_1c] = 0;
      }
    }
    mf->offset = mf->offset - uVar1;
    return;
  }
  __assert_fail("mf->read_pos + mf->offset == MUST_NORMALIZE_POS",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                ,0x6e,"void normalize(lzma_mf *)");
}

Assistant:

static void
normalize(lzma_mf *mf)
{
	assert(mf->read_pos + mf->offset == MUST_NORMALIZE_POS);

	// In future we may not want to touch the lowest bits, because there
	// may be match finders that use larger resolution than one byte.
	const uint32_t subvalue
			= (MUST_NORMALIZE_POS - mf->cyclic_size);
				// & (~(UINT32_C(1) << 10) - 1);

	for (uint32_t i = 0; i < mf->hash_count; ++i) {
		// If the distance is greater than the dictionary size,
		// we can simply mark the hash element as empty.
		if (mf->hash[i] <= subvalue)
			mf->hash[i] = EMPTY_HASH_VALUE;
		else
			mf->hash[i] -= subvalue;
	}

	for (uint32_t i = 0; i < mf->sons_count; ++i) {
		// Do the same for mf->son.
		//
		// NOTE: There may be uninitialized elements in mf->son.
		// Valgrind may complain that the "if" below depends on
		// an uninitialized value. In this case it is safe to ignore
		// the warning. See also the comments in lz_encoder_init()
		// in lz_encoder.c.
		if (mf->son[i] <= subvalue)
			mf->son[i] = EMPTY_HASH_VALUE;
		else
			mf->son[i] -= subvalue;
	}

	// Update offset to match the new locations.
	mf->offset -= subvalue;

	return;
}